

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int rebuild_ch_inner_extensions
              (ptls_buffer_t *buf,uint8_t **src,uint8_t *end,uint8_t *outer_ext,
              uint8_t *outer_ext_end)

{
  ushort *src_00;
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  int iVar7;
  uint8_t *puVar8;
  ulong uVar9;
  ulong uVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  uint8_t *puVar13;
  uint8_t *puVar14;
  
  iVar6 = ptls_buffer_reserve_aligned(buf,2,'\0');
  if (iVar6 == 0) {
    puVar13 = buf->base;
    sVar4 = buf->off;
    (puVar13 + sVar4)[0] = '\0';
    (puVar13 + sVar4)[1] = '\0';
    sVar4 = buf->off;
    buf->off = sVar4 + 2;
    puVar13 = *src;
    iVar6 = 0x32;
    if (1 < (ulong)((long)end - (long)puVar13)) {
      *src = puVar13 + 1;
      uVar1 = *puVar13;
      puVar8 = puVar13 + 2;
      *src = puVar8;
      if ((ulong)CONCAT11(uVar1,puVar13[1]) <= (ulong)((long)end - (long)puVar8)) {
        puVar13 = puVar8 + CONCAT11(uVar1,puVar13[1]);
        do {
          if (puVar8 == puVar13) {
            uVar10 = buf->off - (sVar4 + 2);
            if (uVar10 < 0x10000) {
              buf->base[sVar4] = (uint8_t)(uVar10 >> 8);
              buf->base[sVar4 + 1] = (uint8_t)uVar10;
              return 0;
            }
            return 0x20c;
          }
          if ((long)puVar13 - (long)puVar8 < 2) {
            return 0x32;
          }
          uVar1 = *puVar8;
          uVar2 = puVar8[1];
          *src = puVar8 + 2;
          if ((ulong)((long)puVar13 - (long)(puVar8 + 2)) < 2) {
            return 0x32;
          }
          *src = puVar8 + 3;
          uVar3 = puVar8[2];
          puVar14 = puVar8 + 4;
          *src = puVar14;
          uVar10 = (ulong)CONCAT11(uVar3,puVar8[3]);
          if ((ulong)((long)puVar13 - (long)puVar14) < uVar10) {
            return 0x32;
          }
          puVar14 = puVar14 + uVar10;
          if (CONCAT11(uVar1,uVar2) == -0x300) {
            if (uVar10 == 0) {
              return 0x32;
            }
            puVar11 = puVar8 + 5;
            *src = puVar11;
            if ((ulong)((long)puVar14 - (long)puVar11) < (ulong)puVar8[4]) {
              return 0x32;
            }
            puVar12 = puVar11 + puVar8[4];
            do {
              if ((long)puVar12 - (long)puVar11 < 2) {
                return 0x32;
              }
              uVar1 = *puVar11;
              uVar2 = puVar11[1];
              *src = puVar11 + 2;
              if (CONCAT11(uVar1,uVar2) == -499) {
                return 0x2f;
              }
              while( true ) {
                if ((long)outer_ext_end - (long)outer_ext < 2) {
                  return 0x2f;
                }
                if ((long)(outer_ext_end + (-2 - (long)outer_ext)) < 2) {
                  return 0x2f;
                }
                uVar10 = (ulong)(ushort)(*(ushort *)((long)outer_ext + 2) << 8 |
                                        *(ushort *)((long)outer_ext + 2) >> 8);
                src_00 = (ushort *)((long)outer_ext + 4);
                if ((long)outer_ext_end - (long)src_00 < (long)uVar10) {
                  __assert_fail("outer_ext_end - outer_ext >= outersize",
                                "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                                ,0xf63,
                                "int rebuild_ch_inner_extensions(ptls_buffer_t *, const uint8_t **, const uint8_t *const, const uint8_t *, const uint8_t *)"
                               );
                }
                if ((ushort)(*(ushort *)outer_ext << 8 | *(ushort *)outer_ext >> 8) ==
                    CONCAT11(uVar1,uVar2)) break;
                outer_ext = (uint8_t *)((long)src_00 + uVar10);
              }
              iVar7 = ptls_buffer_reserve_aligned(buf,2,'\0');
              if (iVar7 != 0) {
                return iVar7;
              }
              puVar8 = buf->base;
              sVar5 = buf->off;
              puVar8[sVar5] = uVar1;
              puVar8[sVar5 + 1] = uVar2;
              buf->off = buf->off + 2;
              iVar7 = ptls_buffer_reserve_aligned(buf,2,'\0');
              if (iVar7 != 0) {
                return iVar7;
              }
              puVar8 = buf->base;
              sVar5 = buf->off;
              (puVar8 + sVar5)[0] = '\0';
              (puVar8 + sVar5)[1] = '\0';
              sVar5 = buf->off;
              buf->off = sVar5 + 2;
              iVar7 = ptls_buffer__do_pushv(buf,src_00,uVar10);
              if (iVar7 != 0) {
                return iVar7;
              }
              uVar9 = buf->off - (sVar5 + 2);
              if (0xffff < uVar9) {
                return 0x20c;
              }
              outer_ext = (uint8_t *)((long)src_00 + uVar10);
              buf->base[sVar5] = (uint8_t)(uVar9 >> 8);
              buf->base[sVar5 + 1] = (uint8_t)uVar9;
              puVar11 = *src;
              puVar8 = puVar11;
            } while (puVar11 != puVar12);
          }
          else {
            iVar7 = ptls_buffer_reserve_aligned(buf,2,'\0');
            if (iVar7 != 0) {
              return iVar7;
            }
            puVar8 = buf->base;
            sVar5 = buf->off;
            puVar8[sVar5] = uVar1;
            puVar8[sVar5 + 1] = uVar2;
            buf->off = buf->off + 2;
            iVar7 = ptls_buffer_reserve_aligned(buf,2,'\0');
            if (iVar7 != 0) {
              return iVar7;
            }
            puVar8 = buf->base;
            sVar5 = buf->off;
            (puVar8 + sVar5)[0] = '\0';
            (puVar8 + sVar5)[1] = '\0';
            sVar5 = buf->off;
            buf->off = sVar5 + 2;
            iVar7 = ptls_buffer__do_pushv(buf,*src,(long)puVar14 - (long)*src);
            if (iVar7 != 0) {
              return iVar7;
            }
            *src = puVar14;
            uVar10 = buf->off - (sVar5 + 2);
            if (0xffff < uVar10) {
              return 0x20c;
            }
            buf->base[sVar5] = (uint8_t)(uVar10 >> 8);
            buf->base[sVar5 + 1] = (uint8_t)uVar10;
            puVar8 = *src;
          }
        } while (puVar8 == puVar14);
      }
    }
  }
  return iVar6;
}

Assistant:

static int rebuild_ch_inner_extensions(ptls_buffer_t *buf, const uint8_t **src, const uint8_t *const end, const uint8_t *outer_ext,
                                       const uint8_t *outer_ext_end)
{
    int ret;

    ptls_buffer_push_block(buf, 2, {
        ptls_decode_open_block(*src, end, 2, {
            while (*src != end) {
                uint16_t exttype;
                if ((ret = ptls_decode16(&exttype, src, end)) != 0)
                    goto Exit;
                ptls_decode_open_block(*src, end, 2, {
                    if (exttype == PTLS_EXTENSION_TYPE_ECH_OUTER_EXTENSIONS) {
                        ptls_decode_open_block(*src, end, 1, {
                            do {
                                uint16_t reftype;
                                uint16_t outertype;
                                uint16_t outersize;
                                if ((ret = ptls_decode16(&reftype, src, end)) != 0)
                                    goto Exit;
                                if (reftype == PTLS_EXTENSION_TYPE_ENCRYPTED_CLIENT_HELLO) {
                                    ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                                    goto Exit;
                                }
                                while (1) {
                                    if (ptls_decode16(&outertype, &outer_ext, outer_ext_end) != 0 ||
                                        ptls_decode16(&outersize, &outer_ext, outer_ext_end) != 0) {
                                        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                                        goto Exit;
                                    }
                                    assert(outer_ext_end - outer_ext >= outersize);
                                    if (outertype == reftype)
                                        break;
                                    outer_ext += outersize;
                                }
                                buffer_push_extension(buf, reftype, {
                                    ptls_buffer_pushv(buf, outer_ext, outersize);
                                    outer_ext += outersize;
                                });
                            } while (*src != end);
                        });
                    } else {
                        buffer_push_extension(buf, exttype, {
                            ptls_buffer_pushv(buf, *src, end - *src);
                            *src = end;
                        });
                    }
                });
            }
        });
    });

Exit:
    return ret;
}